

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O2

string * QPDFCryptoProvider::getDefaultProvider_abi_cxx11_(void)

{
  string *in_RDI;
  
  getInstance();
  std::__cxx11::string::string
            ((string *)in_RDI,
             (string *)
             getInstance::instance.m.
             super___shared_ptr<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return in_RDI;
}

Assistant:

std::string
QPDFCryptoProvider::getDefaultProvider()
{
    return getInstance().m->default_provider;
}